

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestHugeFieldNumbersLite::_InternalSerialize
          (TestHugeFieldNumbersLite *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  ForeignMessageLite *value;
  TestAllTypesLite *value_00;
  string_view sVar2;
  bool bVar3;
  int32_t iVar4;
  int iVar5;
  uint uVar6;
  ForeignEnumLite value_01;
  OneofFieldCase OVar7;
  uint32_t value_02;
  TestHugeFieldNumbersLite *extendee;
  uint32_t *puVar8;
  uint8_t *puVar9;
  RepeatedField<int> *pRVar10;
  const_reference piVar11;
  LogMessage *pLVar12;
  const_pointer piVar13;
  string *psVar14;
  UntypedMapBase *pUVar15;
  size_type sVar16;
  reference key;
  reference key_00;
  void *data;
  const_pointer piVar17;
  string *_s_3;
  string *_s_2;
  value_type *entry_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range3_1;
  value_type *entry;
  const_iterator __end3;
  MapSorterIt<const_void_*> local_178;
  const_iterator __begin3;
  MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *field;
  string *_s_1;
  string *_s;
  int byte_size;
  int n;
  int i;
  uint32_t cached_has_bits;
  TestHugeFieldNumbersLite *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestHugeFieldNumbersLite *this_local;
  const_pointer end;
  const_pointer it;
  EpsCopyOutputStream *local_b0;
  byte *local_88;
  ulong local_80;
  LogMessage local_58;
  Voidify local_41;
  byte *local_40;
  undefined4 local_38;
  undefined4 local_34;
  EpsCopyOutputStream *local_30;
  byte *local_28;
  uint local_1c;
  EpsCopyOutputStream *local_18;
  uint local_c;
  
  extendee = default_instance();
  stream_local = (EpsCopyOutputStream *)
                 google::protobuf::internal::ExtensionSet::_InternalSerializeAll
                           (&(this->field_0)._impl_._extensions_,&extendee->super_MessageLite,target
                            ,stream);
  puVar8 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar8;
  if ((uVar1 & 0x10) != 0) {
    puVar9 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar4 = _internal_optional_int32(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                             (0x1ffffc70,iVar4,puVar9);
  }
  if ((uVar1 & 0x20) != 0) {
    puVar9 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar4 = _internal_fixed_32(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                             (0x1ffffc71,iVar4,puVar9);
  }
  byte_size = 0;
  iVar5 = _internal_repeated_int32_size(this);
  for (; byte_size < iVar5; byte_size = byte_size + 1) {
    puVar9 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    pRVar10 = _internal_repeated_int32(this);
    piVar11 = google::protobuf::RepeatedField<int>::Get(pRVar10,byte_size);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                             (0x1ffffc72,*piVar11,puVar9);
  }
  uVar6 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_int32_cached_byte_size_);
  if (0 < (int)uVar6) {
    pRVar10 = _internal_packed_int32(this);
    local_40 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                         (stream,(uint8_t *)stream_local);
    local_34 = 0x1ffffc73;
    local_38 = 2;
    local_30 = stream;
    if (stream->end_ <= local_40) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      pLVar12 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar12);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_58);
    }
    local_28 = local_40;
    for (local_1c = 0xffffe39a; 0x7f < local_1c; local_1c = local_1c >> 7) {
      *local_28 = (byte)local_1c | 0x80;
      local_28 = local_28 + 1;
    }
    *local_28 = (byte)local_1c;
    local_18 = (EpsCopyOutputStream *)(local_28 + 1);
    for (local_c = uVar6; 0x7f < local_c; local_c = local_c >> 7) {
      *(byte *)local_18 = (byte)local_c | 0x80;
      local_18 = (EpsCopyOutputStream *)((long)local_18 + 1);
    }
    local_b0 = (EpsCopyOutputStream *)((long)local_18 + 1);
    *(byte *)local_18 = (byte)local_c;
    local_28 = local_28 + 1;
    local_18 = local_b0;
    piVar13 = google::protobuf::RepeatedField<int>::data(pRVar10);
    iVar5 = google::protobuf::RepeatedField<int>::size(pRVar10);
    end = piVar13;
    do {
      local_88 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_b0);
      piVar17 = end + 1;
      for (local_80 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end);
          0x7f < local_80; local_80 = local_80 >> 7) {
        *local_88 = (byte)local_80 | 0x80;
        local_88 = local_88 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_88 + 1);
      *local_88 = (byte)local_80;
      end = piVar17;
      local_b0 = stream_local;
    } while (piVar17 < piVar13 + iVar5);
  }
  if ((uVar1 & 0x40) != 0) {
    puVar9 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_01 = _internal_optional_enum(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray
                             (0x1ffffc74,value_01,puVar9);
  }
  if ((uVar1 & 1) != 0) {
    psVar14 = _internal_optional_string_abi_cxx11_(this);
    sVar2 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar14)
    ;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,0x1ffffc75,sVar2,(uint8_t *)stream_local);
  }
  if ((uVar1 & 2) != 0) {
    psVar14 = _internal_optional_bytes_abi_cxx11_(this);
    sVar2 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar14)
    ;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteBytesMaybeAliased
                             (stream,0x1ffffc76,sVar2,(uint8_t *)stream_local);
  }
  if ((uVar1 & 4) != 0) {
    value = (this->field_0)._impl_.optional_message_;
    iVar5 = ForeignMessageLite::GetCachedSize((this->field_0)._impl_.optional_message_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0x1ffffc77,&value->super_MessageLite,iVar5,(uint8_t *)stream_local,
                              stream);
  }
  if ((uVar1 & 8) != 0) {
    puVar9 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteGroup
                             (0x1ffffc78,&((this->field_0)._impl_.optionalgroup_)->super_MessageLite
                              ,puVar9,stream);
  }
  pUVar15 = (UntypedMapBase *)_internal_string_string_map_abi_cxx11_(this);
  bVar3 = google::protobuf::internal::UntypedMapBase::empty(pUVar15);
  if (!bVar3) {
    pUVar15 = (UntypedMapBase *)_internal_string_string_map_abi_cxx11_(this);
    bVar3 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if ((bVar3) && (sVar16 = google::protobuf::internal::UntypedMapBase::size(pUVar15), 1 < sVar16))
    {
      google::protobuf::internal::
      MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::MapSorterPtr((MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__begin3,
                     (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)pUVar15);
      local_178.ptr =
           (void **)google::protobuf::internal::
                    MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin((MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&__begin3);
      entry = (value_type *)
              google::protobuf::internal::
              MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__begin3);
      while (bVar3 = google::protobuf::internal::MapSorterIt<const_void_*>::operator!=
                               (&local_178,(MapSorterIt<const_void_*> *)&entry), bVar3) {
        key = google::protobuf::internal::
              MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::const_iterator::operator*((const_iterator *)&local_178);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                       ::InternalSerialize(0x1ffffc7a,&key->first,&key->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::internal::MapSorterIt<const_void_*>::operator++(&local_178);
      }
      google::protobuf::internal::
      MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~MapSorterPtr((MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__begin3);
    }
    else {
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::begin((const_iterator *)&__end3_1.super_UntypedMapIterator.bucket_index_,
              (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)pUVar15);
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::end((const_iterator *)&entry_1,
            (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pUVar15);
      while (bVar3 = google::protobuf::operator!=
                               ((const_iterator *)&__end3_1.super_UntypedMapIterator.bucket_index_,
                                (const_iterator *)&entry_1), bVar3) {
        key_00 = google::protobuf::
                 Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::const_iterator::operator*
                           ((const_iterator *)&__end3_1.super_UntypedMapIterator.bucket_index_);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                       ::InternalSerialize(0x1ffffc7a,&key_00->first,&key_00->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::const_iterator::operator++
                  ((const_iterator *)&__end3_1.super_UntypedMapIterator.bucket_index_);
      }
    }
  }
  OVar7 = oneof_field_case(this);
  switch(OVar7) {
  case kOneofUint32:
    puVar9 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_02 = _internal_oneof_uint32(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                             (0x1ffffc7b,value_02,puVar9);
    break;
  case kOneofTestAllTypes:
    value_00 = (this->field_0)._impl_.oneof_field_.oneof_test_all_types_;
    iVar5 = TestAllTypesLite::GetCachedSize
                      ((this->field_0)._impl_.oneof_field_.oneof_test_all_types_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0x1ffffc7c,&value_00->super_MessageLite,iVar5,(uint8_t *)stream_local,
                              stream);
    break;
  case kOneofString:
    psVar14 = _internal_oneof_string_abi_cxx11_(this);
    sVar2 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar14)
    ;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,0x1ffffc7d,sVar2,(uint8_t *)stream_local);
    break;
  case kOneofBytes:
    psVar14 = _internal_oneof_bytes_abi_cxx11_(this);
    sVar2 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar14)
    ;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteBytesMaybeAliased
                             (stream,0x1ffffc7e,sVar2,(uint8_t *)stream_local);
  }
  bVar3 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar3) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    iVar5 = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,iVar5,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestHugeFieldNumbersLite::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestHugeFieldNumbersLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestHugeFieldNumbersLite)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 optional_int32 = 536870000;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        536870000, this_._internal_optional_int32(), target);
  }

  // int32 fixed_32 = 536870001;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        536870001, this_._internal_fixed_32(), target);
  }

  // repeated int32 repeated_int32 = 536870002;
  for (int i = 0, n = this_._internal_repeated_int32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        536870002, this_._internal_repeated_int32().Get(i), target);
  }

  // repeated int32 packed_int32 = 536870003 [features = {
  {
    int byte_size = this_._impl_._packed_int32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          536870003, this_._internal_packed_int32(), byte_size, target);
    }
  }

  // .proto2_unittest.ForeignEnumLite optional_enum = 536870004;
  if ((cached_has_bits & 0x00000040u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        536870004, this_._internal_optional_enum(), target);
  }

  // string optional_string = 536870005;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_optional_string();
    target = stream->WriteStringMaybeAliased(536870005, _s, target);
  }

  // bytes optional_bytes = 536870006;
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_optional_bytes();
    target = stream->WriteBytesMaybeAliased(536870006, _s, target);
  }

  // .proto2_unittest.ForeignMessageLite optional_message = 536870007;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        536870007, *this_._impl_.optional_message_, this_._impl_.optional_message_->GetCachedSize(), target,
        stream);
  }

  // .proto2_unittest.TestHugeFieldNumbersLite.OptionalGroup optionalgroup = 536870008 [features = {
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
        536870008, *this_._impl_.optionalgroup_, target, stream);
  }

  // map<string, string> string_string_map = 536870010;
  if (!this_._internal_string_string_map().empty()) {
    using MapType = ::google::protobuf::Map<std::string, std::string>;
    using WireHelper = _pbi::MapEntryFuncs<std::string, std::string,
                                   _pbi::WireFormatLite::TYPE_STRING,
                                   _pbi::WireFormatLite::TYPE_STRING>;
    const auto& field = this_._internal_string_string_map();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterPtr<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            536870010, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            536870010, entry.first, entry.second, target, stream);
      }
    }
  }

  switch (this_.oneof_field_case()) {
    case kOneofUint32: {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
          536870011, this_._internal_oneof_uint32(), target);
      break;
    }
    case kOneofTestAllTypes: {
      target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
          536870012, *this_._impl_.oneof_field_.oneof_test_all_types_, this_._impl_.oneof_field_.oneof_test_all_types_->GetCachedSize(), target,
          stream);
      break;
    }
    case kOneofString: {
      const ::std::string& _s = this_._internal_oneof_string();
      target = stream->WriteStringMaybeAliased(536870013, _s, target);
      break;
    }
    case kOneofBytes: {
      const ::std::string& _s = this_._internal_oneof_bytes();
      target = stream->WriteBytesMaybeAliased(536870014, _s, target);
      break;
    }
    default:
      break;
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestHugeFieldNumbersLite)
  return target;
}